

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::CheckTargetsForType(cmGlobalGenerator *this)

{
  string *name;
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  cmake *this_01;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  string *psVar6;
  long lVar7;
  pointer config;
  pointer puVar8;
  allocator<char> local_b9;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  cmGlobalGenerator *local_a0;
  string systemName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_60 [16];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&systemName,"Swift",(allocator<char> *)(local_60 + 0x10));
  bVar3 = GetLanguageEnabled(this,&systemName);
  std::__cxx11::string::~string((string *)&systemName);
  if (bVar3) {
    local_b8 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = false;
    name = (string *)(local_60 + 0x10);
    local_a0 = this;
    for (local_b0 = (this->LocalGenerators).
                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; local_b0 != local_b8;
        local_b0 = local_b0 + 1) {
      pcVar1 = (local_b0->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      local_a8 = *(pointer *)
                  ((long)&(pcVar1->GeneratorTargets).
                          super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  + 8);
      for (puVar8 = *(pointer *)
                     &(pcVar1->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                      ._M_impl; puVar8 != local_a8; puVar8 = puVar8 + 1) {
        this_00 = *(cmMakefile **)
                   ((long)(puVar8->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                   + 8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)name,"CMAKE_SYSTEM_NAME",(allocator<char> *)&local_78);
        psVar6 = cmMakefile::GetSafeDefinition(this_00,name);
        std::__cxx11::string::string((string *)&systemName,(string *)psVar6);
        std::__cxx11::string::~string((string *)name);
        lVar7 = std::__cxx11::string::find((char *)&systemName,0x7212ba);
        if (lVar7 != -1) {
          TVar5 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)
                             (puVar8->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
          if (TVar5 == EXECUTABLE) {
            cmMakefile::GetGeneratorConfigs_abi_cxx11_
                      (&local_78,
                       *(cmMakefile **)
                        ((long)(puVar8->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        + 8),IncludeEmptyConfig);
            pbVar2 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (config = local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; config != pbVar2;
                config = config + 1) {
              bVar4 = cmGeneratorTarget::IsWin32Executable
                                ((cmGeneratorTarget *)
                                 (puVar8->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ,config);
              if (bVar4) {
                cmGeneratorTarget::GetLinkerLanguage
                          (name,(cmGeneratorTarget *)
                                (puVar8->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ,config);
                bVar4 = std::operator==(name,"Swift");
                std::__cxx11::string::~string((string *)name);
                if (bVar4) {
                  this_01 = local_a0->CMakeInstance;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)name,
                             "WIN32_EXECUTABLE property is not supported on Swift executables",
                             &local_b9);
                  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_60);
                  cmake::IssueMessage(this_01,FATAL_ERROR,name,(cmListFileBacktrace *)local_60);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
                  std::__cxx11::string::~string((string *)name);
                  bVar3 = true;
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_78);
          }
        }
        std::__cxx11::string::~string((string *)&systemName);
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForType() const
{
  if (!this->GetLanguageEnabled("Swift")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      std::string systemName =
        target->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
      if (systemName.find("Windows") == std::string::npos) {
        continue;
      }

      if (target->GetType() == cmStateEnums::EXECUTABLE) {
        std::vector<std::string> const& configs =
          target->Makefile->GetGeneratorConfigs(
            cmMakefile::IncludeEmptyConfig);
        for (std::string const& config : configs) {
          if (target->IsWin32Executable(config) &&
              target->GetLinkerLanguage(config) == "Swift") {
            this->GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "WIN32_EXECUTABLE property is not supported on Swift "
              "executables",
              target->GetBacktrace());
            failed = true;
          }
        }
      }
    }
  }
  return failed;
}